

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O3

_Bool nni_taskq_drain(nni_taskq *tq)

{
  int iVar1;
  int iVar2;
  
  nni_mtx_lock(&tq->tq_mtx);
  iVar1 = nni_list_empty(&tq->tq_tasks);
  if (iVar1 == 0) {
    do {
      nni_cv_wait(&tq->tq_wait_cv);
      iVar2 = nni_list_empty(&tq->tq_tasks);
    } while (iVar2 == 0);
  }
  nni_mtx_unlock(&tq->tq_mtx);
  return iVar1 == 0;
}

Assistant:

bool
nni_taskq_drain(nni_taskq *tq)
{
	bool result = false;
	nni_mtx_lock(&tq->tq_mtx);
	while (!nni_list_empty(&tq->tq_tasks)) {
		result = true;
		nni_cv_wait(&tq->tq_wait_cv);
	}
	nni_mtx_unlock(&tq->tq_mtx);
	return (result);
}